

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O0

AssertionResult
bssl::anon_unknown_73::IsPermittedCert
          (NameConstraints *name_constraints,Input subject_rdn_sequence,
          GeneralNames *subject_alt_names)

{
  Input subject_rdn_sequence_00;
  bool bVar1;
  Message *pMVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  pointer in_R8;
  AssertionResult AVar3;
  AssertHelper local_98;
  string local_90;
  Message local_70;
  undefined4 local_68;
  uchar *local_58;
  GeneralNames *pGStack_50;
  undefined1 local_48 [8];
  CertErrors errors;
  GeneralNames *subject_alt_names_local;
  NameConstraints *name_constraints_local;
  Input subject_rdn_sequence_local;
  
  errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_R8;
  CertErrors::CertErrors((CertErrors *)local_48);
  subject_rdn_sequence_00.data_.size_ = (size_t)subject_alt_names;
  subject_rdn_sequence_00.data_.data_ = (uchar *)subject_rdn_sequence.data_.size_;
  local_58 = (uchar *)subject_rdn_sequence.data_.size_;
  pGStack_50 = subject_alt_names;
  NameConstraints::IsPermittedCert
            ((NameConstraints *)subject_rdn_sequence.data_.data_,subject_rdn_sequence_00,
             (GeneralNames *)
             errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,(CertErrors *)local_48);
  bVar1 = CertErrors::ContainsAnyErrorWithSeverity((CertErrors *)local_48,SEVERITY_HIGH);
  if (bVar1) {
    bVar1 = CertErrors::ContainsError((CertErrors *)local_48,"Not permitted by name constraints");
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pMVar2 = testing::Message::operator<<(&local_70,(char (*) [18])"unexpected error ");
      CertErrors::ToDebugString_abi_cxx11_(&local_90,(CertErrors *)local_48);
      pMVar2 = testing::Message::operator<<(pMVar2,&local_90);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/name_constraints_unittest.cc"
                 ,0x53,"Failed");
      testing::internal::AssertHelper::operator=(&local_98,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      ::std::__cxx11::string::~string((string *)&local_90);
      testing::Message::~Message(&local_70);
    }
    testing::AssertionFailure();
  }
  else {
    testing::AssertionSuccess();
  }
  local_68 = 1;
  CertErrors::~CertErrors((CertErrors *)local_48);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = name_constraints;
  return AVar3;
}

Assistant:

::testing::AssertionResult IsPermittedCert(
    const NameConstraints *name_constraints, der::Input subject_rdn_sequence,
    const GeneralNames *subject_alt_names) {
  CertErrors errors;
  name_constraints->IsPermittedCert(subject_rdn_sequence, subject_alt_names,
                                    &errors);
  if (!errors.ContainsAnyErrorWithSeverity(CertError::SEVERITY_HIGH)) {
    return ::testing::AssertionSuccess();
  }
  if (!errors.ContainsError(cert_errors::kNotPermittedByNameConstraints)) {
    ADD_FAILURE() << "unexpected error " << errors.ToDebugString();
  }
  return ::testing::AssertionFailure();
}